

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * coda_stristr(char *s,char *n)

{
  int iVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  char *x;
  char *w;
  char *local_28;
  char *local_20;
  char *local_10;
  char *local_8;
  
  if ((in_RDI == (char *)0x0) || (*in_RDI == '\0')) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = in_RDI;
    if ((in_RSI != (char *)0x0) && (local_10 = in_RDI, *in_RSI != '\0')) {
      for (; *local_10 != '\0'; local_10 = local_10 + 1) {
        iVar1 = tolower((int)*local_10);
        iVar2 = tolower((int)*in_RSI);
        if (iVar1 == iVar2) {
          local_20 = local_10;
          local_28 = in_RSI;
          while( true ) {
            bVar3 = false;
            if (*local_20 != '\0') {
              bVar3 = *local_28 != '\0';
            }
            if (!bVar3) break;
            iVar1 = tolower((int)*local_20);
            iVar2 = tolower((int)*local_28);
            if (iVar1 != iVar2) break;
            local_20 = local_20 + 1;
            local_28 = local_28 + 1;
          }
          if (*local_28 == '\0') {
            return local_10;
          }
        }
      }
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

char *coda_stristr(const char *s, const char *n)
{
	const char *w;
	const char *x;

	if (!s || !*s) return NULL;
	if (!n || !*n) return (char *) s;

	for (; *s; ++s)
	{
		if (tolower(*s) == tolower(*n))
		{
			for (w = s, x = n; *w && *x; ++w, ++x)
			{
				if (tolower(*w) != tolower(*x)) break;
			}

			if (!*x) return (char *) s;
		}
	}

	return NULL;
}